

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O1

void __thiscall cmCMakePath::GetNativePath(cmCMakePath *this,string *path)

{
  path tmp;
  long *local_60 [2];
  long local_50 [2];
  path local_40;
  
  std::filesystem::__cxx11::path::path(&local_40,&this->Path);
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,local_40._M_pathname._M_dataplus._M_p,
             local_40._M_pathname._M_dataplus._M_p + local_40._M_pathname._M_string_length);
  std::__cxx11::string::operator=((string *)path,(string *)local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_40);
  return;
}

Assistant:

void cmCMakePath::GetNativePath(std::string& path) const
{
  cm::filesystem::path tmp(this->Path);
  tmp.make_preferred();

  path = tmp.string();
}